

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

void __thiscall SQVM::LeaveFrame(SQVM *this)

{
  CallInfo *pCVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = this->_top;
  lVar3 = this->_stackbase;
  lVar2 = this->_callsstacksize;
  this->_callsstacksize = lVar2 + -1;
  SQObjectPtr::Null(&this->ci->_closure);
  pCVar1 = (CallInfo *)0x0;
  if (lVar2 != 1) {
    pCVar1 = this->_callsstack + lVar2 + -2;
  }
  lVar2 = this->_stackbase - (long)this->ci->_prevstkbase;
  this->_stackbase = lVar2;
  this->_top = this->ci->_prevtop + lVar2;
  this->ci = pCVar1;
  if (this->_openouters != (SQOuter *)0x0) {
    CloseOuters(this,(this->_stack)._vals + lVar3);
  }
  lVar3 = lVar4 << 4;
  for (; this->_top <= lVar4; lVar4 = lVar4 + -1) {
    SQObjectPtr::Null((SQObjectPtr *)((long)&(((this->_stack)._vals)->super_SQObject)._type + lVar3)
                     );
    lVar3 = lVar3 + -0x10;
  }
  return;
}

Assistant:

void SQVM::LeaveFrame() {
    SQInteger last_top = _top;
    SQInteger last_stackbase = _stackbase;
    SQInteger css = --_callsstacksize;

    /* First clean out the call stack frame */
    ci->_closure.Null();
    _stackbase -= ci->_prevstkbase;
    _top = _stackbase + ci->_prevtop;
    ci = (css) ? &_callsstack[css-1] : NULL;

    if(_openouters) CloseOuters(&(_stack._vals[last_stackbase]));
    while (last_top >= _top) {
        _stack._vals[last_top--].Null();
    }
}